

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedmemory.h
# Opt level: O0

void __thiscall QSharedMemory::setNativeKey(QSharedMemory *this,QString *key,Type type)

{
  long lVar1;
  QNativeIpcKey *in_RDI;
  long in_FS_OFFSET;
  undefined6 in_stack_ffffffffffffff90;
  Type in_stack_ffffffffffffff96;
  QNativeIpcKeyPrivate *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QNativeIpcKey::QNativeIpcKey
            ((QNativeIpcKey *)&stack0xffffffffffffffd0,(QString *)in_RDI,in_stack_ffffffffffffff96);
  setNativeKey((QSharedMemory *)in_stack_ffffffffffffffd0,in_RDI);
  QNativeIpcKey::~QNativeIpcKey
            ((QNativeIpcKey *)CONCAT26(in_stack_ffffffffffffff96,in_stack_ffffffffffffff90));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void setNativeKey(const QString &key, QNativeIpcKey::Type type = QNativeIpcKey::legacyDefaultTypeForOs())
    { setNativeKey({ key, type }); }